

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageStack.h
# Opt level: O1

bool __thiscall
PageStack<Memory::MarkContext::MarkCandidate>::Pop
          (PageStack<Memory::MarkContext::MarkCandidate> *this,MarkCandidate *item)

{
  PagePool *this_00;
  MarkCandidate *pMVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Chunk *pCVar5;
  size_t sVar6;
  
  if (this->currentChunk == (Chunk *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0x4b,"(currentChunk != nullptr)","currentChunk != nullptr");
    if (!bVar3) goto LAB_0072d5cb;
    *puVar4 = 0;
  }
  if (this->nextEntry == this->chunkStart) {
    pCVar5 = this->currentChunk;
    if (pCVar5->nextChunk == (Chunk *)0x0) {
      if (this->count == 0) {
        return false;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                         ,0x53,"(count == 0)","count == 0");
      if (!bVar3) goto LAB_0072d5cb;
      bVar3 = false;
      goto LAB_0072d5b6;
    }
    this->currentChunk = pCVar5->nextChunk;
    this->pageCount = this->pageCount - 1;
    this_00 = this->pagePool;
    if ((pCVar5->super_PagePoolPage).isReserved == true) {
      Memory::PagePool::FreeReservedPage(this_00,&pCVar5->super_PagePoolPage);
    }
    else {
      pCVar5->nextChunk = (Chunk *)this_00->freePageList;
      this_00->freePageList = (PagePoolFreePage *)pCVar5;
    }
    this->chunkStart = (MarkCandidate *)(this->currentChunk + 1);
    pCVar5 = this->currentChunk + 0x80;
    this->chunkEnd = (MarkCandidate *)pCVar5;
    this->nextEntry = (MarkCandidate *)pCVar5;
  }
  if ((this->nextEntry <= this->chunkStart) || (this->chunkEnd < this->nextEntry)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0x60,"(nextEntry > chunkStart && nextEntry <= chunkEnd)",
                       "nextEntry > chunkStart && nextEntry <= chunkEnd");
    if (!bVar3) goto LAB_0072d5cb;
    *puVar4 = 0;
  }
  pMVar1 = this->nextEntry;
  this->nextEntry = pMVar1 + -1;
  sVar6 = pMVar1[-1].byteCount;
  item->obj = pMVar1[-1].obj;
  item->byteCount = sVar6;
  sVar6 = this->count - 1;
  this->count = sVar6;
  if (sVar6 == (this->pageCount * 0xfe + ((long)this->nextEntry - (long)this->chunkStart >> 4)) -
               0xfe) {
    return true;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar4 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                     ,0x6a,"(count == (nextEntry - chunkStart) + (pageCount - 1) * EntriesPerChunk)"
                     ,"count == (nextEntry - chunkStart) + (pageCount - 1) * EntriesPerChunk");
  if (bVar3) {
    bVar3 = true;
LAB_0072d5b6:
    *puVar4 = 0;
    return bVar3;
  }
LAB_0072d5cb:
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

inline
bool PageStack<T>::Pop(T * item)
{
    Assert(currentChunk != nullptr);

    if (nextEntry == chunkStart)
    {
        // We're at the beginning of the chunk.  Move to the previous chunk, if any
        if (currentChunk->nextChunk == nullptr)
        {
            // All done
            Assert(count == 0);
            return false;
        }

        Chunk * temp = currentChunk;
        currentChunk = currentChunk->nextChunk;
        FreeChunk(temp);

        chunkStart = currentChunk->entries;
        chunkEnd = &currentChunk->entries[EntriesPerChunk];
        nextEntry = chunkEnd;
    }

    Assert(nextEntry > chunkStart && nextEntry <= chunkEnd);

    nextEntry--;
#if defined(_M_IX86) || defined(_M_X64)
    _mm_prefetch((char*) (nextEntry - 1), _MM_HINT_T0);
#endif
    *item = *nextEntry;

#if DBG
    count--;
    Assert(count == (nextEntry - chunkStart) + (pageCount - 1) * EntriesPerChunk);
#endif

    return true;
}